

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

bool __thiscall
cmRuntimeDependencyArchive::IsPreExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  bool bVar1;
  reference pRVar2;
  char *pcVar3;
  RegularExpression *regex_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1_1;
  RegularExpression *regex;
  iterator __end1;
  iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  RegularExpressionMatch match;
  string *name_local;
  cmRuntimeDependencyArchive *this_local;
  
  match.searchstring = (char *)name;
  cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)&__range1);
  __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                     (&this->PreIncludeRegexes);
  regex = (RegularExpression *)
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                    (&this->PreIncludeRegexes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                *)&regex);
    if (!bVar1) {
      __end1_1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->PreExcludeRegexes);
      regex_1 = (RegularExpression *)
                std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                end(&this->PreExcludeRegexes);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                            *)&regex_1);
        if (!bVar1) {
          return false;
        }
        pRVar2 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end1_1);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find(pRVar2,pcVar3,(RegularExpressionMatch *)&__range1);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end1_1);
      }
      return true;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
             ::operator*(&__end1);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find(pRVar2,pcVar3,(RegularExpressionMatch *)&__range1);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPreExcluded(const std::string& name)
{
  cmsys::RegularExpressionMatch match;

  for (auto const& regex : this->PreIncludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return false;
    }
  }

  for (auto const& regex : this->PreExcludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return true;
    }
  }

  return false;
}